

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O3

int Gia_WinTryAddingNode(Gia_Man_t *p,int iPivot,int iPivot2,Vec_Wec_t *vLevels,Vec_Int_t *vNodes)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  Vec_Int_t *pVVar11;
  Vec_Int_t *pVVar12;
  Gia_Obj_t *pGVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  
  if (0 < (long)vLevels->nSize) {
    lVar14 = 0;
    iVar16 = 0;
    do {
      iVar16 = iVar16 + *(int *)((long)&vLevels->pArray->nSize + lVar14);
      lVar14 = lVar14 + 0x10;
    } while ((long)vLevels->nSize * 0x10 != lVar14);
    if (iVar16 != 0) {
      __assert_fail("Vec_WecSizeSize(vLevels) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                    ,0x23e,
                    "int Gia_WinTryAddingNode(Gia_Man_t *, int, int, Vec_Wec_t *, Vec_Int_t *)");
    }
  }
  if (iPivot < p->nTravIdsAlloc) {
    if (p->pTravIds[iPivot] == p->nTravIds) {
      __assert_fail("!Gia_ObjIsTravIdCurrentId(p, iPivot)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                    ,0x240,
                    "int Gia_WinTryAddingNode(Gia_Man_t *, int, int, Vec_Wec_t *, Vec_Int_t *)");
    }
    p->pTravIds[iPivot] = p->nTravIds;
    uVar10 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,iPivot);
    iVar16 = vLevels->nSize;
    if (iVar16 <= (int)uVar10) {
      iVar19 = uVar10 + 1;
      iVar20 = iVar16 * 2;
      if (iVar16 * 2 <= iVar19) {
        iVar20 = iVar19;
      }
      iVar16 = vLevels->nCap;
      if (iVar16 < iVar20) {
        if (vLevels->pArray == (Vec_Int_t *)0x0) {
          pVVar11 = (Vec_Int_t *)malloc((long)iVar20 << 4);
        }
        else {
          pVVar11 = (Vec_Int_t *)realloc(vLevels->pArray,(long)iVar20 << 4);
          iVar16 = vLevels->nCap;
        }
        vLevels->pArray = pVVar11;
        memset(pVVar11 + iVar16,0,(long)(iVar20 - iVar16) << 4);
        vLevels->nCap = iVar20;
      }
      vLevels->nSize = iVar19;
      iVar16 = iVar19;
    }
    if (((int)uVar10 < 0) || (iVar16 <= (int)uVar10)) {
LAB_007aecfd:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    Vec_IntPush(vLevels->pArray + uVar10,iPivot);
    if (iPivot2 != -1) {
      if (p->nTravIdsAlloc <= iPivot2) goto LAB_007aed3b;
      if (p->pTravIds[iPivot2] == p->nTravIds) {
        __assert_fail("!Gia_ObjIsTravIdCurrentId(p, iPivot2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                      ,0x248,
                      "int Gia_WinTryAddingNode(Gia_Man_t *, int, int, Vec_Wec_t *, Vec_Int_t *)");
      }
      p->pTravIds[iPivot2] = p->nTravIds;
      uVar10 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,iPivot2);
      iVar16 = vLevels->nSize;
      if (iVar16 <= (int)uVar10) {
        iVar19 = uVar10 + 1;
        iVar20 = iVar16 * 2;
        if (iVar16 * 2 <= iVar19) {
          iVar20 = iVar19;
        }
        iVar16 = vLevels->nCap;
        if (iVar16 < iVar20) {
          if (vLevels->pArray == (Vec_Int_t *)0x0) {
            pVVar11 = (Vec_Int_t *)malloc((long)iVar20 << 4);
          }
          else {
            pVVar11 = (Vec_Int_t *)realloc(vLevels->pArray,(long)iVar20 << 4);
            iVar16 = vLevels->nCap;
          }
          vLevels->pArray = pVVar11;
          memset(pVVar11 + iVar16,0,(long)(iVar20 - iVar16) << 4);
          vLevels->nCap = iVar20;
        }
        vLevels->nSize = iVar19;
        iVar16 = iVar19;
      }
      if (((int)uVar10 < 0) || (iVar16 <= (int)uVar10)) goto LAB_007aecfd;
      Vec_IntPush(vLevels->pArray + uVar10,iPivot2);
    }
    iVar16 = vLevels->nSize;
    if (iVar16 < 1) {
      return 0;
    }
    lVar14 = 0;
    iVar19 = 0;
LAB_007ae876:
    pVVar11 = vLevels->pArray;
    if (0 < pVVar11[lVar14].nSize) {
      lVar15 = 0;
LAB_007ae8a0:
      iVar16 = pVVar11[lVar14].pArray[lVar15];
      if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_007aecbf;
      pGVar13 = p->pObjs;
      if (pGVar13 != (Gia_Obj_t *)0x0) {
        pGVar1 = pGVar13 + iVar16;
        iVar16 = 0;
        do {
          pGVar2 = pGVar13 + p->nObjs;
          if (pGVar2 <= pGVar1) goto LAB_007aeca0;
          uVar10 = (int)((long)pGVar1 - (long)pGVar13 >> 2) * -0x55555555;
          if (((int)uVar10 < 0) || (p->vFanoutNums->nSize <= (int)uVar10)) {
LAB_007aec81:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (p->vFanoutNums->pArray[uVar10 & 0x7fffffff] <= iVar16) goto LAB_007aeb89;
          uVar5 = p->vFanout->nSize;
          if ((int)uVar5 <= (int)uVar10) goto LAB_007aec81;
          piVar8 = p->vFanout->pArray;
          uVar10 = piVar8[uVar10 & 0x7fffffff] + iVar16;
          if (((int)uVar10 < 0) || (uVar5 <= uVar10)) goto LAB_007aec81;
          iVar20 = piVar8[uVar10];
          lVar17 = (long)iVar20;
          if ((lVar17 < 0) || (p->nObjs <= iVar20)) goto LAB_007aecbf;
          iVar16 = iVar16 + 1;
          if (iVar16 == 6) goto LAB_007aeb89;
          pGVar3 = pGVar13 + lVar17;
          uVar9 = *(ulong *)pGVar3;
          if ((uVar9 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
            iVar6 = p->nTravIdsAlloc;
            if (iVar6 <= iVar20) {
LAB_007aecde:
              __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
            }
            piVar8 = p->pTravIds;
            iVar7 = p->nTravIds;
            if (piVar8[lVar17] != iVar7) {
              pGVar4 = pGVar3 + -(uVar9 & 0x1fffffff);
              if ((pGVar4 < pGVar13) || (pGVar2 <= pGVar4)) goto LAB_007aeca0;
              iVar18 = (int)((long)pGVar4 - (long)pGVar13 >> 2) * -0x55555555;
              if (iVar6 <= iVar18) goto LAB_007aecde;
              if (piVar8[iVar18] == iVar7) {
                pGVar4 = pGVar3 + -(ulong)((uint)(uVar9 >> 0x20) & 0x1fffffff);
                if ((pGVar4 < pGVar13) || (pGVar2 <= pGVar4)) goto LAB_007aeca0;
                iVar18 = (int)((long)pGVar4 - (long)pGVar13 >> 2) * -0x55555555;
                if (iVar6 <= iVar18) goto LAB_007aecde;
                if (piVar8[iVar18] == iVar7) {
                  piVar8[lVar17] = iVar7;
                  if (p->nObjs <= iVar20) goto LAB_007aeca0;
                  uVar10 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,iVar20);
                  pGVar13 = p->pObjs;
                  if ((pGVar3 < pGVar13) || (pGVar13 + p->nObjs <= pGVar3)) goto LAB_007aeca0;
                  iVar20 = vLevels->nSize;
                  if (iVar20 <= (int)uVar10) {
                    iVar6 = uVar10 + 1;
                    iVar7 = iVar20 * 2;
                    if (iVar20 * 2 <= iVar6) {
                      iVar7 = iVar6;
                    }
                    iVar20 = vLevels->nCap;
                    if (iVar20 < iVar7) {
                      if (vLevels->pArray == (Vec_Int_t *)0x0) {
                        pVVar12 = (Vec_Int_t *)malloc((long)iVar7 << 4);
                      }
                      else {
                        pVVar12 = (Vec_Int_t *)realloc(vLevels->pArray,(long)iVar7 << 4);
                        iVar20 = vLevels->nCap;
                      }
                      vLevels->pArray = pVVar12;
                      memset(pVVar12 + iVar20,0,(long)(iVar7 - iVar20) << 4);
                      vLevels->nCap = iVar7;
                    }
                    vLevels->nSize = iVar6;
                    iVar20 = iVar6;
                  }
                  if (((int)uVar10 < 0) || (iVar20 <= (int)uVar10)) goto LAB_007aecfd;
                  Vec_IntPush(vLevels->pArray + uVar10,
                              (int)((ulong)((long)pGVar3 - (long)pGVar13) >> 2) * -0x55555555);
                  iVar19 = iVar19 + 1;
                  pGVar13 = p->pObjs;
                }
              }
            }
          }
          if (pGVar1 < pGVar13) {
LAB_007aeca0:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
        } while( true );
      }
      goto LAB_007aeba3;
    }
    goto LAB_007aebab;
  }
LAB_007aed3b:
  __assert_fail("Id < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
LAB_007aeb89:
  lVar15 = lVar15 + 1;
  if (pVVar11[lVar14].nSize <= lVar15) goto LAB_007aeba3;
  goto LAB_007ae8a0;
LAB_007aeba3:
  iVar16 = vLevels->nSize;
LAB_007aebab:
  lVar14 = lVar14 + 1;
  if (iVar16 <= lVar14) {
    if (0 < iVar16) {
      lVar14 = 0;
      do {
        pVVar11 = vLevels->pArray;
        if (0 < pVVar11[lVar14].nSize) {
          lVar15 = 0;
          do {
            iVar16 = pVVar11[lVar14].pArray[lVar15];
            if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) {
LAB_007aecbf:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            if (vNodes == (Vec_Int_t *)0x0) {
              if (p->nTravIdsAlloc <= iVar16) {
                __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x263,"void Gia_ObjSetTravIdPrevious(Gia_Man_t *, Gia_Obj_t *)");
              }
              p->pTravIds[iVar16] = p->nTravIds + -1;
            }
            else {
              Vec_IntPush(vNodes,iVar16);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < pVVar11[lVar14].nSize);
          iVar16 = vLevels->nSize;
        }
        pVVar11[lVar14].nSize = 0;
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar16);
    }
    return iVar19;
  }
  goto LAB_007ae876;
}

Assistant:

int Gia_WinTryAddingNode( Gia_Man_t * p, int iPivot, int iPivot2, Vec_Wec_t * vLevels, Vec_Int_t * vNodes )
{
    Vec_Int_t * vLevel; 
    Gia_Obj_t * pObj, * pFanout;
    int k, i, f, Count = 0;
    // precondition:  the levelized structure is empty
    assert( Vec_WecSizeSize(vLevels) == 0 );
    // precondition:  the new object to be added (iPivot) is not in the window
    assert( !Gia_ObjIsTravIdCurrentId(p, iPivot) );
    // add the object to the window and to the levelized structure
    Gia_ObjSetTravIdCurrentId( p, iPivot );
    Vec_WecPush( vLevels, Gia_ObjLevelId(p, iPivot), iPivot );
    // the same about the second node if it is given
    if ( iPivot2 != -1 )
    {
        // precondition:  the new object to be added (iPivot2) is not in the window
        assert( !Gia_ObjIsTravIdCurrentId(p, iPivot2) );
        // add the object to the window and to the levelized structure
        Gia_ObjSetTravIdCurrentId( p, iPivot2 );
        Vec_WecPush( vLevels, Gia_ObjLevelId(p, iPivot2), iPivot2 );
    }
    // iterate through all objects and explore their fanouts
    Vec_WecForEachLevel( vLevels, vLevel, k )
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            Gia_ObjForEachFanoutStatic( p, pObj, pFanout, f )
            {
                if ( f == 5 ) // explore first 5 fanouts of the node
                    break;
                if ( Gia_ObjIsAnd(pFanout) && // internal node
                    !Gia_ObjIsTravIdCurrent(p, pFanout) && // not in the window
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pFanout)) && // but fanins are
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pFanout)) )  // in the window
                {
                    // add fanout to the window and to the levelized structure
                    Gia_ObjSetTravIdCurrent( p, pFanout );
                    Vec_WecPush( vLevels, Gia_ObjLevel(p, pFanout), Gia_ObjId(p, pFanout) );
                    // count the number of nodes in the structure
                    Count++;
                }
            }
    // iterate through the nodes in the levelized structure
    Vec_WecForEachLevel( vLevels, vLevel, k )
    {
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            if ( vNodes == NULL ) // it was a test run - unmark the node
                Gia_ObjSetTravIdPrevious( p, pObj );
            else // it was a real run - permanently add to the node to the window
                Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        // clean the levelized structure
        Vec_IntClear( vLevel );
    }
    // return the number of nodes to be added
    return Count;
}